

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

string * __thiscall
arm::format_bb_name_abi_cxx11_
          (string *__return_storage_ptr__,arm *this,string_view func_name,uint32_t bb_id)

{
  ostream *poVar1;
  stringstream name;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(char *)func_name._M_len,(long)this);
  poVar1 = std::operator<<(poVar1,"_$bb");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string format_bb_name(std::string_view func_name, uint32_t bb_id) {
  std::stringstream name;
  name << func_name << "_$bb" << bb_id;
  return name.str();
}